

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprism.cpp
# Opt level: O0

void pztopology::TPZPrism::ComputeHCurlDirections<double>
               (TPZFMatrix<double> *gradx,TPZFMatrix<double> *directions,
               TPZVec<int> *transformationIds)

{
  double dVar1;
  double dVar2;
  _func_int **pp_Var3;
  int iVar4;
  uint uVar5;
  double *pdVar6;
  int *piVar7;
  uint *puVar8;
  TPZFMatrix<double> *this;
  TPZVec<int> *in_RDX;
  bool bVar9;
  double dVar10;
  int i_2;
  int x;
  TPZFMatrix<double> axes;
  int iFace_1;
  int firstVftVec;
  TPZManVector<double,_2> vft2;
  TPZManVector<double,_2> vft1;
  int i_1;
  int iFace;
  int iEdge;
  TPZManVector<double,_5> faceOrient;
  TPZManVector<double,_9> edgeSign;
  REAL faceArea [5];
  REAL edgeLength [9];
  int nFaces;
  int nEdges;
  int i;
  TPZManVector<double,_3> v3;
  TPZManVector<double,_3> v2;
  TPZManVector<double,_3> v1;
  TPZManVector<double,_9> *in_stack_fffffffffffff030;
  TPZVec<double> *in_stack_fffffffffffff038;
  TPZVec<double> *in_stack_fffffffffffff040;
  double *in_stack_fffffffffffff048;
  TPZFMatrix<double> *in_stack_fffffffffffff050;
  int64_t in_stack_fffffffffffff058;
  TPZManVector<double,_9> *in_stack_fffffffffffff060;
  TPZFMatrix<double> *in_stack_fffffffffffff078;
  TPZFMatrix<double> *in_stack_fffffffffffff0d0;
  double *in_stack_fffffffffffff398;
  int local_4d8;
  int local_4d4;
  TPZTransform<double> local_4d0;
  int local_2a0;
  undefined4 local_29c;
  undefined8 local_298;
  TPZVec<double> local_290;
  undefined8 local_260;
  TPZVec<double> local_258;
  int local_224;
  int local_220;
  int local_21c;
  undefined8 local_218;
  TPZVec<double> local_210 [2];
  undefined8 local_1c8;
  TPZVec<double> local_1c0 [3];
  double local_158;
  double dStack_150;
  double local_148;
  double dStack_140;
  double local_138;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  undefined4 local_dc;
  undefined4 local_d8;
  int local_d4;
  TPZVec<double> local_d0 [2];
  TPZVec<double> local_88;
  TPZVec<double> local_50;
  TPZVec<int> *local_18;
  
  local_18 = in_RDX;
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048
            );
  for (local_d4 = 0; local_d4 < 3; local_d4 = local_d4 + 1) {
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_50,(long)local_d4);
    *pdVar6 = dVar10;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_88,(long)local_d4);
    *pdVar6 = dVar10;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_d0,(long)local_d4);
    *pdVar6 = dVar10;
  }
  local_d8 = 9;
  local_dc = 5;
  local_e8 = 1.0;
  local_f8 = 1.0;
  dStack_f0 = 1.4142135623730951;
  local_108 = 2.0;
  dStack_100 = 2.0;
  local_118 = 1.0;
  dStack_110 = 2.0;
  local_128 = 1.0;
  dStack_120 = 1.4142135623730951;
  local_158 = 0.5;
  dStack_150 = 2.0;
  local_148 = 2.8284271247461903;
  dStack_140 = 2.0;
  local_138 = 0.5;
  local_1c8 = 0;
  TPZManVector<double,_9>::TPZManVector
            (in_stack_fffffffffffff060,in_stack_fffffffffffff058,(double *)in_stack_fffffffffffff050
            );
  local_218 = 0;
  TPZManVector<double,_5>::TPZManVector
            ((TPZManVector<double,_5> *)in_stack_fffffffffffff060,in_stack_fffffffffffff058,
             (double *)in_stack_fffffffffffff050);
  for (local_21c = 0; local_21c < 9; local_21c = local_21c + 1) {
    piVar7 = TPZVec<int>::operator[](local_18,(long)local_21c);
    iVar4 = *piVar7;
    pdVar6 = TPZVec<double>::operator[](local_1c0,(long)local_21c);
    *pdVar6 = (double)(int)(-(uint)(iVar4 != 0) | 1);
  }
  for (local_220 = 0; local_220 < 5; local_220 = local_220 + 1) {
    puVar8 = (uint *)TPZVec<int>::operator[](local_18,(long)(local_220 + 9));
    uVar5 = *puVar8;
    bVar9 = uVar5 == (uVar5 - ((int)uVar5 >> 0x1f) & 0xfffffffe);
    pdVar6 = TPZVec<double>::operator[](local_210,(long)local_220);
    *pdVar6 = (double)(int)((bVar9 - 1) + (uint)bVar9);
  }
  for (local_224 = 0; local_224 < 3; local_224 = local_224 + 1) {
    pdVar6 = TPZVec<double>::operator[](&local_50,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,0);
    dVar10 = (dVar10 * *pdVar6) / local_128;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](&local_50,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_88,(long)local_224);
    dVar1 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,0);
    dVar10 = ((dVar10 + dVar1) * *pdVar6) / local_128;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](&local_88,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,1);
    dVar10 = (dVar10 * 1.4142135623730951 * *pdVar6) / dStack_120;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](&local_50,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,1);
    dVar10 = (dVar10 * -1.4142135623730951 * *pdVar6) / dStack_120;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](&local_50,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_88,(long)local_224);
    dVar1 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,2);
    dVar10 = (-(dVar10 + dVar1) * *pdVar6) / local_118;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](&local_88,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,2);
    dVar10 = (-dVar10 * *pdVar6) / local_118;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_d0,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,3);
    dVar10 = (dVar10 * *pdVar6) / dStack_110;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_d0,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,3);
    dVar10 = (dVar10 * *pdVar6) / dStack_110;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_d0,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,4);
    dVar10 = (dVar10 * *pdVar6) / local_108;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_d0,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,4);
    dVar10 = (dVar10 * *pdVar6) / local_108;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_d0,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,5);
    dVar10 = (dVar10 * *pdVar6) / dStack_100;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_d0,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,5);
    dVar10 = (dVar10 * *pdVar6) / dStack_100;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](&local_50,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,6);
    dVar10 = (dVar10 * *pdVar6) / local_f8;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](&local_50,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_88,(long)local_224);
    dVar1 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,6);
    dVar10 = ((dVar10 + dVar1) * *pdVar6) / local_f8;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](&local_88,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,7);
    dVar10 = (dVar10 * 1.4142135623730951 * *pdVar6) / dStack_f0;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](&local_50,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,7);
    dVar10 = (dVar10 * -1.4142135623730951 * *pdVar6) / dStack_f0;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](&local_50,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_88,(long)local_224);
    dVar1 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,8);
    dVar10 = (-(dVar10 + dVar1) * *pdVar6) / local_e8;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](&local_88,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,8);
    dVar10 = (-dVar10 * *pdVar6) / local_e8;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](&local_50,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_88,(long)local_224);
    dVar1 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,0);
    dVar10 = ((dVar1 * 0.5 + dVar10) * *pdVar6) / local_128;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](&local_88,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_50,(long)local_224);
    dVar1 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,1);
    dVar10 = ((dVar10 - dVar1) * 0.7071067811865476 * *pdVar6) / dStack_120;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](&local_50,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_88,(long)local_224);
    dVar1 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,2);
    dVar10 = ((dVar10 * -0.5 - dVar1) * *pdVar6) / local_118;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_d0,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,3);
    dVar10 = (dVar10 * *pdVar6) / dStack_110;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_d0,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,4);
    dVar10 = (dVar10 * *pdVar6) / local_108;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_d0,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,5);
    dVar10 = (dVar10 * *pdVar6) / dStack_100;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](&local_50,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_88,(long)local_224);
    dVar1 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,6);
    dVar10 = ((dVar1 * 0.5 + dVar10) * *pdVar6) / local_f8;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](&local_88,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_50,(long)local_224);
    dVar1 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,7);
    dVar10 = ((dVar10 - dVar1) * 0.7071067811865476 * *pdVar6) / dStack_f0;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](&local_50,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_88,(long)local_224);
    dVar1 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,8);
    dVar10 = ((dVar10 * -0.5 - dVar1) * *pdVar6) / local_e8;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_210,0);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,0);
    dVar1 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_88,(long)local_224);
    dVar10 = (dVar10 * dVar1 * *pdVar6) / local_158;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_210,0);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,1);
    dVar1 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_50,(long)local_224);
    dVar2 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_88,(long)local_224);
    dVar10 = (-(dVar10 * dVar1) * (dVar2 + *pdVar6)) / local_158;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_210,0);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,2);
    dVar1 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_50,(long)local_224);
    dVar10 = (dVar10 * dVar1 * *pdVar6) / local_158;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_210,1);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,0);
    dVar1 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_d0,(long)local_224);
    dVar10 = (dVar10 * dVar1 * 0.5 * *pdVar6) / dStack_150;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_210,1);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,4);
    dVar1 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_50,(long)local_224);
    dVar2 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_88,(long)local_224);
    dVar10 = (-(dVar10 * dVar1) * (dVar2 + *pdVar6)) / dStack_150;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_210,1);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,6);
    dVar1 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_d0,(long)local_224);
    dVar10 = (dVar10 * dVar1 * 0.5 * *pdVar6) / dStack_150;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_210,1);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,3);
    dVar1 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_50,(long)local_224);
    dVar10 = (dVar10 * dVar1 * -*pdVar6) / dStack_150;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_210,2);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,1);
    dVar1 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_d0,(long)local_224);
    dVar10 = (dVar10 * dVar1 * 0.7071067811865476 * *pdVar6) / local_148;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_210,2);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,5);
    dVar1 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_50,(long)local_224);
    dVar10 = (dVar10 * dVar1 * 1.4142135623730951 * *pdVar6) / local_148;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_210,2);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,7);
    dVar1 = *pdVar6;
    in_stack_fffffffffffff398 = TPZVec<double>::operator[](local_d0,(long)local_224);
    dVar10 = (dVar10 * dVar1 * 0.7071067811865476 * *in_stack_fffffffffffff398) / local_148;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_210,2);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,4);
    dVar1 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_88,(long)local_224);
    dVar10 = (dVar10 * dVar1 * -1.4142135623730951 * *pdVar6) / local_148;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_210,3);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,2);
    dVar1 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_d0,(long)local_224);
    dVar10 = (dVar10 * dVar1 * -0.5 * *pdVar6) / dStack_140;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_210,3);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,5);
    dVar1 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_50,(long)local_224);
    dVar2 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_88,(long)local_224);
    dVar10 = (-(dVar10 * dVar1) * (dVar2 + *pdVar6)) / dStack_140;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_210,3);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,8);
    dVar1 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_d0,(long)local_224);
    dVar10 = (dVar10 * dVar1 * -0.5 * *pdVar6) / dStack_140;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_210,3);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,3);
    dVar1 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_88,(long)local_224);
    dVar10 = (dVar10 * dVar1 * -*pdVar6) / dStack_140;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_210,4);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,6);
    dVar1 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_88,(long)local_224);
    dVar10 = (dVar10 * dVar1 * *pdVar6) / local_138;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_210,4);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,7);
    dVar1 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_50,(long)local_224);
    dVar2 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_88,(long)local_224);
    dVar10 = (-(dVar10 * dVar1) * (dVar2 + *pdVar6)) / local_138;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_210,4);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_1c0,8);
    dVar1 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_50,(long)local_224);
    dVar10 = (dVar10 * dVar1 * *pdVar6) / local_138;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_d0,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = -dVar10;
    pdVar6 = TPZVec<double>::operator[](&local_88,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = -dVar10;
    pdVar6 = TPZVec<double>::operator[](&local_50,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](&local_88,(long)local_224);
    dVar1 = *pdVar6;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = (dVar10 + dVar1) * 0.7071067811865476;
    pdVar6 = TPZVec<double>::operator[](&local_50,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = -dVar10;
    pdVar6 = TPZVec<double>::operator[](local_d0,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](&local_50,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](&local_88,(long)local_224);
    dVar10 = *pdVar6;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = dVar10;
    pdVar6 = TPZVec<double>::operator[](local_d0,(long)local_224);
    in_stack_fffffffffffff0d0 = (TPZFMatrix<double> *)*pdVar6;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = (double)in_stack_fffffffffffff0d0;
  }
  local_260 = 0;
  TPZManVector<double,_2>::TPZManVector
            ((TPZManVector<double,_2> *)in_stack_fffffffffffff060,in_stack_fffffffffffff058,
             (double *)in_stack_fffffffffffff050);
  local_298 = 0;
  TPZManVector<double,_2>::TPZManVector
            ((TPZManVector<double,_2> *)in_stack_fffffffffffff060,in_stack_fffffffffffff058,
             (double *)in_stack_fffffffffffff050);
  local_29c = 0x2d;
  local_2a0 = 0;
  do {
    if (4 < local_2a0) {
      TPZManVector<double,_2>::~TPZManVector((TPZManVector<double,_2> *)in_stack_fffffffffffff030);
      TPZManVector<double,_2>::~TPZManVector((TPZManVector<double,_2> *)in_stack_fffffffffffff030);
      TPZManVector<double,_5>::~TPZManVector((TPZManVector<double,_5> *)in_stack_fffffffffffff030);
      TPZManVector<double,_9>::~TPZManVector(in_stack_fffffffffffff030);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffff030);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffff030);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffff030);
      return;
    }
    if (local_2a0 == 0) {
LAB_01520013:
      TPZVec<int>::operator[](local_18,(long)(local_2a0 + 9));
      TPZTriangle::ComputeHCurlFaceDirections<double>
                (in_stack_fffffffffffff040,in_stack_fffffffffffff038,
                 (int)((ulong)in_stack_fffffffffffff030 >> 0x20));
    }
    else if (local_2a0 - 1U < 3) {
      TPZVec<int>::operator[](local_18,(long)(local_2a0 + 9));
      TPZQuadrilateral::ComputeHCurlFaceDirections<double>
                (in_stack_fffffffffffff040,in_stack_fffffffffffff038,
                 (int)((ulong)in_stack_fffffffffffff030 >> 0x20));
    }
    else if (local_2a0 == 4) goto LAB_01520013;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = 0.0;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = 0.0;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = 0.0;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = 0.0;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = 0.0;
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
    *pdVar6 = 0.0;
    TransformElementToSide((int)((ulong)in_stack_fffffffffffff398 >> 0x20));
    this = TPZTransform<double>::Mult(&local_4d0);
    TPZFMatrix<double>::TPZFMatrix(this,in_stack_fffffffffffff078);
    TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x1520250);
    TPZFMatrix<double>::Transpose(in_stack_fffffffffffff0d0);
    for (local_4d4 = 0; local_4d4 < 3; local_4d4 = local_4d4 + 1) {
      for (local_4d8 = 0; local_4d8 < 2; local_4d8 = local_4d8 + 1) {
        in_stack_fffffffffffff078 =
             (TPZFMatrix<double> *)
             TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
        pp_Var3 = (in_stack_fffffffffffff078->super_TPZMatrix<double>).super_TPZBaseMatrix.
                  super_TPZSavable._vptr_TPZSavable;
        pdVar6 = TPZVec<double>::operator[](&local_258,(long)local_4d8);
        dVar10 = *pdVar6;
        pdVar6 = TPZFMatrix<double>::operator()
                           (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                            (int64_t)in_stack_fffffffffffff040);
        *pdVar6 = (double)pp_Var3 * dVar10 + *pdVar6;
        in_stack_fffffffffffff050 =
             (TPZFMatrix<double> *)
             TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
        in_stack_fffffffffffff040 =
             (TPZVec<double> *)
             (in_stack_fffffffffffff050->super_TPZMatrix<double>).super_TPZBaseMatrix.
             super_TPZSavable._vptr_TPZSavable;
        in_stack_fffffffffffff048 = TPZVec<double>::operator[](&local_290,(long)local_4d8);
        in_stack_fffffffffffff030 = (TPZManVector<double,_9> *)*in_stack_fffffffffffff048;
        in_stack_fffffffffffff038 =
             (TPZVec<double> *)
             TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048,
                        (int64_t)in_stack_fffffffffffff040);
        in_stack_fffffffffffff038->_vptr_TPZVec =
             (_func_int **)
             ((double)in_stack_fffffffffffff040 * (double)in_stack_fffffffffffff030 +
             (double)in_stack_fffffffffffff038->_vptr_TPZVec);
      }
    }
    TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1520472);
    local_2a0 = local_2a0 + 1;
  } while( true );
}

Assistant:

void TPZPrism::ComputeHCurlDirections(TPZFMatrix<TVar> &gradx, TPZFMatrix<TVar> &directions, const TPZVec<int> &transformationIds)
    {
        TPZManVector<TVar,3> v1(3),v2(3),v3(3);

        for (int i=0; i<3; i++) {
            v1[i] = gradx(i,0);
            v2[i] = gradx(i,1);
            v3[i] = gradx(i,2);
        }
        constexpr auto nEdges = 9;
        constexpr auto nFaces = 5;
        //edges                      6,  7    ,8,9,10,11,12,   13,  14
        constexpr REAL edgeLength[nEdges]{1,M_SQRT2,1,2, 2, 2, 1,M_SQRT2,1};
        //faces                    15,16,    17,   18,19
        constexpr REAL faceArea[nFaces]{0.5,2,2*M_SQRT2,2,0.5};
        TPZManVector<REAL,nEdges> edgeSign(nEdges,0);
        TPZManVector<REAL,nFaces>  faceOrient(nFaces,0);

        for(auto iEdge = 0; iEdge < nEdges; iEdge++){
            edgeSign[iEdge] = transformationIds[iEdge] == 0 ? 1 : -1;
        }
        for(auto iFace = 0; iFace < nFaces; iFace++){
            faceOrient[iFace] = transformationIds[nEdges + iFace] % 2 == 0 ? 1 : -1;
        }
        for (int i=0; i<3; i++) {
            //v^{e,a} constant vector fields associated with edge e and vertex a
            //they are defined in such a way that v^{e,a} is normal to the edge \hat{e}
            //adjacent to edge e by the vertex a. the tangential component is set to be 1 /edgeLength[e]

            directions(i, 0) = (v1[i]) * edgeSign[0] / edgeLength[0];//edge 6  vertex 0
            directions(i, 1) = (v1[i] + v2[i]) * edgeSign[0] / edgeLength[0];//edge 6 vertex 1
            directions(i, 2) = (v2[i] * M_SQRT2) * edgeSign[1] / edgeLength[1];//edge 7 vertex 1
            directions(i, 3) = (-v1[i] * M_SQRT2) * edgeSign[1] / edgeLength[1];//edge 7 vertex 2
            directions(i, 4) = (v1[i] + v2[i]) * -1 * edgeSign[2] / edgeLength[2]; //edge 8 vertex 2
            directions(i, 5) = (-v2[i]) * edgeSign[2] / edgeLength[2]; //edge 8 vertex 0

            directions(i, 6) = v3[i] * edgeSign[3] / edgeLength[3];//edge 9 vertex 0
            directions(i, 7) = v3[i] * edgeSign[3] / edgeLength[3];//edge 9 vertex 3
            directions(i, 8) = v3[i] * edgeSign[4] / edgeLength[4];//edge 10 vertex 1
            directions(i, 9) = v3[i] * edgeSign[4] / edgeLength[4];//edge 10 vertex 4
            directions(i, 10) = v3[i] * edgeSign[5] / edgeLength[5];//edge 11 vertex 2
            directions(i, 11) = v3[i] * edgeSign[5] / edgeLength[5];//edge 11 vertex 5

            directions(i, 12) = (v1[i]) * edgeSign[6] / edgeLength[6];//edge 12 vertex 3
            directions(i, 13) = (v1[i] + v2[i]) * edgeSign[6] / edgeLength[6];//edge 12 vertex 4
            directions(i, 14) = (v2[i] * M_SQRT2) * edgeSign[7] / edgeLength[7];//edge 13 vertex 4
            directions(i, 15) = (-v1[i] * M_SQRT2) * edgeSign[7] / edgeLength[7];//edge 13 vertex 5
            directions(i, 16) = (v1[i] + v2[i]) * -1 * edgeSign[8] / edgeLength[8];//edge 14 vertex 5
            directions(i, 17) = (-v2[i]) * edgeSign[8] / edgeLength[8];//edge 14 vertex 3

            //v^{e,T} constant vector fields associated with edge e and aligned with it
            directions(i, 18) = (v1[i]+0.5*v2[i]) * edgeSign[0] / edgeLength[0];//edge 6
            directions(i, 19) = ((v2[i] - v1[i]) * M_SQRT1_2) * edgeSign[1] / edgeLength[1];//edge 7
            directions(i, 20) = (-0.5*v1[i]-v2[i]) * edgeSign[2] / edgeLength[2];//edge 8

            directions(i, 21) = v3[i] * edgeSign[3] / edgeLength[3];//edge 9
            directions(i, 22) = v3[i] * edgeSign[4] / edgeLength[4];//edge 10
            directions(i, 23) = v3[i] * edgeSign[5] / edgeLength[5];//edge 11

            directions(i, 24) = (v1[i]+0.5*v2[i]) * edgeSign[6] / edgeLength[6];//edge 12
            directions(i, 25) = ((v2[i] - v1[i]) * M_SQRT1_2) * edgeSign[7] / edgeLength[7];//edge 13
            directions(i, 26) = (-0.5*v1[i]-v2[i]) * edgeSign[8] / edgeLength[8];//edge 14

            //v^{F,e} constant vector fields associated with face F and edge e
            //they are defined in such a way that v^{F,e} is normal to the face \hat{F}
            //adjacent to face F by edge e
            directions(i, 27) = faceOrient[0] * edgeSign[6 - NCornerNodes] * v2[i]  / faceArea[0];//face 15 edge 6
            directions(i, 28) = faceOrient[0] * edgeSign[7 - NCornerNodes] * -1 * (v1[i] + v2[i])  / faceArea[0];//face 15 edge 7
            directions(i, 29) = faceOrient[0] * edgeSign[8 - NCornerNodes] * v1[i]  / faceArea[0];//face 15 edge 8

            directions(i, 30) = faceOrient[1] * edgeSign[6 - NCornerNodes] *  0.5 * v3[i] / faceArea[1];//face 16 edge 6
            directions(i, 31) = faceOrient[1] * edgeSign[10 - NCornerNodes] *  -1 * (v1[i]+v2[i]) / faceArea[1];//face 16 edge 10
            directions(i, 32) = faceOrient[1] * edgeSign[12 - NCornerNodes] *  0.5 * v3[i] / faceArea[1];;//face 16 edge 12
            directions(i, 33) = faceOrient[1] * edgeSign[9 - NCornerNodes] *  -v1[i] / faceArea[1];//face 16 edge 9

            directions(i, 34) = faceOrient[2] * edgeSign[7 - NCornerNodes] *  M_SQRT1_2 * v3[i] / faceArea[2];//face 17 edge 7
            directions(i, 35) = faceOrient[2] * edgeSign[11 - NCornerNodes] *  M_SQRT2 * v1[i] / faceArea[2];//face 17 edge 11
            directions(i, 36) = faceOrient[2] * edgeSign[13 - NCornerNodes] *  M_SQRT1_2 * v3[i] / faceArea[2];//face 17 edge 13
            directions(i, 37) = faceOrient[2] * edgeSign[10 - NCornerNodes] *  -M_SQRT2 * v2[i] / faceArea[2];//face 17 edge 10

            directions(i, 38) = faceOrient[3] * edgeSign[8 - NCornerNodes] * -0.5 * v3[i] / faceArea[3];//face 18 edge 8
            directions(i, 39) = faceOrient[3] * edgeSign[11 - NCornerNodes] *  -1 * (v1[i] + v2[i]) / faceArea[3];//face 18 edge 11
            directions(i, 40) = faceOrient[3] * edgeSign[14 - NCornerNodes] * -0.5 * v3[i] / faceArea[3];//face 18 edge 14
            directions(i, 41) = faceOrient[3] * edgeSign[9 - NCornerNodes] * -v2[i] / faceArea[3];//face 18 edge 9

            directions(i, 42) = faceOrient[4] * edgeSign[12 - NCornerNodes] * v2[i]  / faceArea[4];//face 19 edge 12
            directions(i, 43) = faceOrient[4] * edgeSign[13 - NCornerNodes] * -1 * (v1[i] + v2[i] )  / faceArea[4];//face 19 edge 13
            directions(i, 44) = faceOrient[4] * edgeSign[14 - NCornerNodes] * v1[i]  / faceArea[4];//face 19 edge 14

            //v^{F,T} are calculated afterwards

            //v^{F,orth} vector associated with face F and normal to it
            directions(i, 55) = -v3[i];//face 15
            directions(i, 56) = -v2[i];//face 16
            directions(i, 57) = (v1[i] + v2[i]) * M_SQRT1_2;//face 17
            directions(i, 58) = -v1[i];//face 18
            directions(i, 59) = v3[i];//face 19

            //v^{K,3}
            directions(i, 60) = v1[i];
            directions(i, 61) = v2[i];
            directions(i, 62) = v3[i];
        }

        TPZManVector<REAL,2> vft1(2,0), vft2(2,0);
        constexpr auto firstVftVec = 45;
        //v^{F,T} orthonormal vectors associated with face F and tangent to it.
        for(auto iFace = 0; iFace < nFaces; iFace ++){
            switch(iFace){
                case 0:
                case 4:
                    TPZTriangle::ComputeHCurlFaceDirections(vft1,vft2,transformationIds[nEdges + iFace]);
                    break;
                case 1:
                case 2:
                case 3:
                    TPZQuadrilateral::ComputeHCurlFaceDirections(vft1,vft2,transformationIds[nEdges + iFace]);
                    break;
            }
            directions(0,firstVftVec+2*iFace) = 0;directions(1,firstVftVec+2*iFace) = 0;directions(2,firstVftVec+2*iFace) = 0;
            directions(0,firstVftVec+2*iFace+1) = 0;directions(1,firstVftVec+2*iFace+1) = 0;directions(2,firstVftVec+2*iFace+1) = 0;
            auto axes = TPZPrism::TransformElementToSide(NCornerNodes+nEdges+iFace).Mult();
            axes.Transpose();
            for(auto x = 0; x < Dimension; x++){
                for(auto i = 0; i < 2; i++) {
                    directions(x, firstVftVec + 2 * iFace) += axes(x,i) * vft1[i];
                    directions(x, firstVftVec + 2 * iFace + 1) += axes(x,i) * vft2[i];
                }
            }
        }
    }